

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateCompileJSONEntry
                (jx9_gen_state *pGen,SyToken *pIn,SyToken *pEnd,sxi32 iFlags,
                _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xValidator)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  undefined4 in_register_0000000c;
  
  pSVar1 = pGen->pIn;
  pSVar2 = pGen->pEnd;
  pGen->pIn = pIn;
  pGen->pEnd = pEnd;
  sVar3 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)
                                CONCAT44(in_register_0000000c,iFlags));
  pGen->pIn = pSVar1;
  pGen->pEnd = pSVar2;
  return sVar3;
}

Assistant:

static sxi32 GenStateCompileJSONEntry(
	jx9_gen_state *pGen, /* Code generator state */
	SyToken *pIn,        /* Token stream */
	SyToken *pEnd,       /* End of the token stream */
	sxi32 iFlags,        /* Compilation flags */
	sxi32 (*xValidator)(jx9_gen_state *,jx9_expr_node *) /* Expression tree validator callback */
	)
{
	SyToken *pTmpIn, *pTmpEnd;
	sxi32 rc;
	/* Swap token stream */
	SWAP_DELIMITER(pGen, pIn, pEnd);
	/* Compile the expression*/
	rc = jx9CompileExpr(&(*pGen), iFlags, xValidator);
	/* Restore token stream */
	RE_SWAP_DELIMITER(pGen);
	return rc;
}